

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_make_sorted_files(archive_write *a,isoent *isoent,idr *idr)

{
  long in_RDX;
  long in_RSI;
  archive *in_RDI;
  idrent *idrent;
  isoent **children;
  archive_rb_node *rn;
  uintptr_t *local_30;
  archive_rb_node *local_28;
  int local_4;
  
  local_30 = (uintptr_t *)malloc((long)*(int *)(in_RSI + 0x38) << 3);
  if (local_30 == (uintptr_t *)0x0) {
    archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
    local_4 = -0x1e;
  }
  else {
    *(uintptr_t **)(in_RSI + 0x68) = local_30;
    local_28 = __archive_rb_tree_iterate((archive_rb_tree *)(in_RDX + 8),(archive_rb_node *)0x0,0);
    while (local_28 != (archive_rb_node *)0x0) {
      *local_30 = local_28[1].rb_info;
      local_28 = __archive_rb_tree_iterate((archive_rb_tree *)(in_RDX + 8),local_28,1);
      local_30 = local_30 + 1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
isoent_make_sorted_files(struct archive_write *a, struct isoent *isoent,
    struct idr *idr)
{
	struct archive_rb_node *rn;
	struct isoent **children;

	children = malloc(isoent->children.cnt * sizeof(struct isoent *));
	if (children == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	isoent->children_sorted = children;

	ARCHIVE_RB_TREE_FOREACH(rn, &(idr->rbtree)) {
		struct idrent *idrent = (struct idrent *)rn;
		*children ++ = idrent->isoent;
	}
	return (ARCHIVE_OK);
}